

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcmap.c
# Opt level: O0

FT_UInt32 tt_cmap8_char_next(TT_CMap cmap,FT_UInt32 *pchar_code)

{
  FT_Byte *pFVar1;
  uint uVar2;
  uint uVar3;
  FT_UInt32 start_id;
  FT_UInt32 end;
  FT_UInt32 start;
  FT_UInt32 num_groups;
  FT_Byte *p;
  FT_Byte *table;
  uint local_30;
  FT_UInt gindex;
  FT_UInt32 char_code;
  FT_UInt32 result;
  FT_Face face;
  FT_UInt32 *pchar_code_local;
  TT_CMap cmap_local;
  
  gindex = 0;
  table._4_4_ = 0;
  pFVar1 = cmap->data;
  end = (uint)pFVar1[0x200c] << 0x18 | (uint)pFVar1[0x200d] << 0x10 | (uint)pFVar1[0x200e] << 8 |
        (uint)pFVar1[0x200f];
  if (*pchar_code == 0xffffffff) {
    cmap_local._4_4_ = 0;
  }
  else {
    local_30 = *pchar_code + 1;
    _start = pFVar1 + 0x2010;
    for (; end != 0; end = end - 1) {
      uVar2 = (uint)*_start << 0x18 | (uint)_start[1] << 0x10 | (uint)_start[2] << 8 |
              (uint)_start[3];
      uVar3 = (uint)_start[8] << 0x18 | (uint)_start[9] << 0x10 | (uint)_start[10] << 8 |
              (uint)_start[0xb];
      if (local_30 < uVar2) {
        local_30 = uVar2;
      }
      while( true ) {
        if ((((uint)_start[4] << 0x18 | (uint)_start[5] << 0x10 | (uint)_start[6] << 8 |
             (uint)_start[7]) < local_30) || (0xffffffff - (ulong)(local_30 - uVar2) < (ulong)uVar3)
           ) goto LAB_0018a06f;
        table._4_4_ = uVar3 + (local_30 - uVar2);
        if (table._4_4_ != 0) break;
        if (local_30 == 0xffffffff) goto LAB_0018a07d;
        local_30 = local_30 + 1;
      }
      if (table._4_4_ < (uint)((cmap->cmap).charmap.face)->num_glyphs) {
        gindex = local_30;
        break;
      }
      table._4_4_ = 0;
LAB_0018a06f:
      _start = _start + 0xc;
    }
LAB_0018a07d:
    *pchar_code = gindex;
    cmap_local._4_4_ = table._4_4_;
  }
  return cmap_local._4_4_;
}

Assistant:

FT_CALLBACK_DEF( FT_UInt32 )
  tt_cmap8_char_next( TT_CMap     cmap,
                      FT_UInt32  *pchar_code )
  {
    FT_Face    face       = cmap->cmap.charmap.face;
    FT_UInt32  result     = 0;
    FT_UInt32  char_code;
    FT_UInt    gindex     = 0;
    FT_Byte*   table      = cmap->data;
    FT_Byte*   p          = table + 8204;
    FT_UInt32  num_groups = TT_NEXT_ULONG( p );
    FT_UInt32  start, end, start_id;


    if ( *pchar_code >= 0xFFFFFFFFUL )
      return 0;

    char_code = *pchar_code + 1;

    p = table + 8208;

    for ( ; num_groups > 0; num_groups-- )
    {
      start    = TT_NEXT_ULONG( p );
      end      = TT_NEXT_ULONG( p );
      start_id = TT_NEXT_ULONG( p );

      if ( char_code < start )
        char_code = start;

    Again:
      if ( char_code <= end )
      {
        /* ignore invalid group */
        if ( start_id > 0xFFFFFFFFUL - ( char_code - start ) )
          continue;

        gindex = (FT_UInt)( start_id + ( char_code - start ) );

        /* does first element of group point to `.notdef' glyph? */
        if ( gindex == 0 )
        {
          if ( char_code >= 0xFFFFFFFFUL )
            break;

          char_code++;
          goto Again;
        }

        /* if `gindex' is invalid, the remaining values */
        /* in this group are invalid, too               */
        if ( gindex >= (FT_UInt)face->num_glyphs )
        {
          gindex = 0;
          continue;
        }

        result = char_code;
        break;
      }
    }

    *pchar_code = result;
    return gindex;
  }